

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e
ktxTexture2_inflateZLIBInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxTexture2_private *pkVar1;
  bool bVar2;
  ktx_uint32_t kVar3;
  ktx_error_code_e kVar4;
  void *__ptr;
  ulong uVar5;
  uint uVar6;
  ktxLevelIndexEntry *__dest;
  ktx_error_code_e kVar7;
  long lVar8;
  float fVar9;
  size_t levelByteLength;
  ktx_size_t local_68;
  ktx_size_t local_58;
  ktx_size_t local_50;
  ulong local_48;
  ktx_uint8_t *local_40;
  ktx_uint8_t *local_38;
  
  kVar7 = KTX_INVALID_VALUE;
  if ((pInflatedData != (ktx_uint8_t *)0x0 && pDeflatedData != (ktx_uint8_t *)0x0) &&
     (kVar7 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_END_RANGE)) {
    pkVar1 = This->_private;
    uVar5 = (ulong)(This->numLevels * 0x18);
    local_40 = pDeflatedData;
    local_38 = pInflatedData;
    __ptr = malloc(uVar5);
    if (__ptr == (void *)0x0) {
      kVar7 = KTX_OUT_OF_MEMORY;
    }
    else {
      __dest = pkVar1->_levelIndex;
      local_48 = uVar5;
      kVar3 = ktxTexture2_calcPostInflationLevelAlignment(This);
      uVar6 = This->numLevels;
      lVar8 = 0;
      local_68 = 0;
      local_58 = inflatedDataCapacity;
      do {
        uVar6 = uVar6 - 1;
        if ((int)uVar6 < 0) break;
        local_50 = local_58;
        uVar5 = (ulong)(uVar6 & 0x7fffffff);
        kVar4 = ktxUncompressZLIBInt
                          (local_38 + lVar8,&local_50,local_40 + __dest[uVar5].byteOffset,
                           pkVar1->_levelIndex[uVar5].byteLength);
        if (kVar4 == KTX_SUCCESS) {
          if (This->_private->_levelIndex[uVar5].uncompressedByteLength == local_50) {
            *(long *)((long)__ptr + uVar5 * 0x18) = lVar8;
            *(ktx_size_t *)((long)__ptr + uVar5 * 0x18 + 8) = local_50;
            *(ktx_size_t *)((long)__ptr + uVar5 * 0x18 + 0x10) = local_50;
            fVar9 = ceilf((float)local_50 / (float)kVar3);
            uVar5 = (long)(fVar9 * (float)kVar3) & 0xffffffff;
            local_68 = local_68 + uVar5;
            lVar8 = lVar8 + uVar5;
            local_58 = local_58 - uVar5;
            bVar2 = true;
          }
          else {
            free(__ptr);
            kVar7 = KTX_DECOMPRESS_LENGTH_ERROR;
            bVar2 = false;
          }
        }
        else {
          free(__ptr);
          bVar2 = false;
          kVar7 = kVar4;
        }
      } while (bVar2);
      if ((int)uVar6 < 0) {
        This->dataSize = local_68;
        This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
        memcpy(__dest,__ptr,local_48);
        free(__ptr);
        This->_private->_requiredLevelAlignment = kVar3;
        kVar7 = KTX_SUCCESS;
      }
    }
  }
  return kVar7;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZLIBInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint32_t uncompressedLevelAlignment;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength = inflatedDataCapacity;
        KTX_error_code result = ktxUncompressZLIBInt(pInflatedData + levelOffset,
                                                    &levelByteLength,
                                                    &pDeflatedData[cindex[level].byteOffset],
                                                    cindex[level].byteLength);
        if (result != KTX_SUCCESS) {
            free(nindex);
            return result;
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            free(nindex);
            return KTX_DECOMPRESS_LENGTH_ERROR;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(nindex);
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

    return KTX_SUCCESS;
}